

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

cali_id_t cali_make_loop_iteration_attribute(char *name)

{
  string *name_00;
  Attribute AVar1;
  cali_id_t cVar2;
  allocator<char> local_61;
  Variant v_true;
  string local_50 [32];
  Caliper c;
  
  v_true.m_v.type_and_size = 7;
  v_true.m_v.value.v_uint = 1;
  cali::Caliper::Caliper(&c);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"iteration#",&local_61);
  name_00 = (string *)std::__cxx11::string::append((char *)local_50);
  AVar1 = cali::Caliper::create_attribute
                    (&c,name_00,CALI_TYPE_INT,1,1,(Attribute *)&cali::class_iteration_attr,&v_true);
  std::__cxx11::string::~string(local_50);
  if (AVar1.m_node == (Node *)0x0) {
    cVar2 = 0xffffffffffffffff;
  }
  else {
    cVar2 = (AVar1.m_node)->m_id;
  }
  return cVar2;
}

Assistant:

cali_id_t cali_make_loop_iteration_attribute(const char* name)
{
    Variant v_true(true);

    Caliper   c;
    Attribute attr = c.create_attribute(
        std::string("iteration#").append(name),
        CALI_TYPE_INT,
        CALI_ATTR_ASVALUE,
        1,
        &class_iteration_attr,
        &v_true
    );

    return attr.id();
}